

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O0

void net_uv::net_adjustBuffSize(uv_handle_t *handle,int32_t minRecvBufSize,int32_t minSendBufSize)

{
  int local_1c;
  int32_t r;
  int32_t len;
  int32_t minSendBufSize_local;
  int32_t minRecvBufSize_local;
  uv_handle_t *handle_local;
  
  local_1c = 0;
  r = minSendBufSize;
  len = minRecvBufSize;
  _minSendBufSize_local = handle;
  uv_recv_buffer_size(handle,&local_1c);
  if (local_1c < len) {
    local_1c = len;
    uv_recv_buffer_size(_minSendBufSize_local,&local_1c);
  }
  local_1c = 0;
  uv_send_buffer_size(_minSendBufSize_local,&local_1c);
  if (local_1c < r) {
    local_1c = r;
    uv_send_buffer_size(_minSendBufSize_local,&local_1c);
  }
  return;
}

Assistant:

void net_adjustBuffSize(uv_handle_t* handle, int32_t minRecvBufSize, int32_t minSendBufSize)
{
	int32_t len = 0;
	int32_t r = uv_recv_buffer_size(handle, &len);
	CHECK_UV_ASSERT(r);

	if (len < minRecvBufSize)
	{
		len = minRecvBufSize;
		r = uv_recv_buffer_size(handle, &len);
		CHECK_UV_ASSERT(r);
	}

	len = 0;
	r = uv_send_buffer_size(handle, &len);
	CHECK_UV_ASSERT(r);

	if (len < minSendBufSize)
	{
		len = minSendBufSize;
		r = uv_send_buffer_size(handle, &len);
		CHECK_UV_ASSERT(r);
	}
}